

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void glcts::ArraysOfArrays::initTests<glcts::ArraysOfArrays::Interface::GL>
               (TestCaseGroup *group,Context *context)

{
  TestNode *pTVar1;
  Context *context_local;
  TestCaseGroup *group_local;
  
  initializeMap<glcts::ArraysOfArrays::Interface::GL>();
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::GL>::SizedDeclarationsPrimitive
            ((SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsStructTypes1<glcts::ArraysOfArrays::Interface::GL>::SizedDeclarationsStructTypes1
            ((SizedDeclarationsStructTypes1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsStructTypes2<glcts::ArraysOfArrays::Interface::GL>::SizedDeclarationsStructTypes2
            ((SizedDeclarationsStructTypes2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::GL>::SizedDeclarationsStructTypes3
            ((SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsStructTypes4<glcts::ArraysOfArrays::Interface::GL>::SizedDeclarationsStructTypes4
            ((SizedDeclarationsStructTypes4<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::GL>::
  SizedDeclarationsTypenameStyle1
            ((SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context
            );
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsTypenameStyle2<glcts::ArraysOfArrays::Interface::GL>::
  SizedDeclarationsTypenameStyle2
            ((SizedDeclarationsTypenameStyle2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context
            );
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsTypenameStyle3<glcts::ArraysOfArrays::Interface::GL>::
  SizedDeclarationsTypenameStyle3
            ((SizedDeclarationsTypenameStyle3<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context
            );
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::GL>::
  SizedDeclarationsTypenameStyle4
            ((SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context
            );
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsTypenameStyle5<glcts::ArraysOfArrays::Interface::GL>::
  SizedDeclarationsTypenameStyle5
            ((SizedDeclarationsTypenameStyle5<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context
            );
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SizedDeclarationsFunctionParams<glcts::ArraysOfArrays::Interface::GL>::
  SizedDeclarationsFunctionParams
            ((SizedDeclarationsFunctionParams<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context
            );
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  sized_declarations_invalid_sizes1<glcts::ArraysOfArrays::Interface::GL>::
  sized_declarations_invalid_sizes1
            ((sized_declarations_invalid_sizes1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,
             context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  sized_declarations_invalid_sizes2<glcts::ArraysOfArrays::Interface::GL>::
  sized_declarations_invalid_sizes2
            ((sized_declarations_invalid_sizes2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,
             context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  sized_declarations_invalid_sizes3<glcts::ArraysOfArrays::Interface::GL>::
  sized_declarations_invalid_sizes3
            ((sized_declarations_invalid_sizes3<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,
             context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  sized_declarations_invalid_sizes4<glcts::ArraysOfArrays::Interface::GL>::
  sized_declarations_invalid_sizes4
            ((sized_declarations_invalid_sizes4<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,
             context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclConstructors1
            ((ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1
             ,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclConstructors2<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclConstructors2
            ((ConstructorsAndUnsizedDeclConstructors2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1
             ,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclUnsizedConstructors
            ((ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::GL> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclConst<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclConst
            ((ConstructorsAndUnsizedDeclConst<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context
            );
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclInvalidConstructors1<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclInvalidConstructors1
            ((ConstructorsAndUnsizedDeclInvalidConstructors1<glcts::ArraysOfArrays::Interface::GL> *
             )pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclInvalidConstructors2<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclInvalidConstructors2
            ((ConstructorsAndUnsizedDeclInvalidConstructors2<glcts::ArraysOfArrays::Interface::GL> *
             )pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclInvalidConstructors3<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclInvalidConstructors3
            ((ConstructorsAndUnsizedDeclInvalidConstructors3<glcts::ArraysOfArrays::Interface::GL> *
             )pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclInvalidConstructors4<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclInvalidConstructors4
            ((ConstructorsAndUnsizedDeclInvalidConstructors4<glcts::ArraysOfArrays::Interface::GL> *
             )pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclConstructorSizing1<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclConstructorSizing1
            ((ConstructorsAndUnsizedDeclConstructorSizing1<glcts::ArraysOfArrays::Interface::GL> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclConstructorSizing2<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclConstructorSizing2
            ((ConstructorsAndUnsizedDeclConstructorSizing2<glcts::ArraysOfArrays::Interface::GL> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclStructConstructors
            ((ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclUnsizedArrays1<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclUnsizedArrays1
            ((ConstructorsAndUnsizedDeclUnsizedArrays1<glcts::ArraysOfArrays::Interface::GL> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclUnsizedArrays2<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclUnsizedArrays2
            ((ConstructorsAndUnsizedDeclUnsizedArrays2<glcts::ArraysOfArrays::Interface::GL> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclUnsizedArrays3<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclUnsizedArrays3
            ((ConstructorsAndUnsizedDeclUnsizedArrays3<glcts::ArraysOfArrays::Interface::GL> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ConstructorsAndUnsizedDeclUnsizedArrays4<glcts::ArraysOfArrays::Interface::GL>::
  ConstructorsAndUnsizedDeclUnsizedArrays4
            ((ConstructorsAndUnsizedDeclUnsizedArrays4<glcts::ArraysOfArrays::Interface::GL> *)
             pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsAssignment1<glcts::ArraysOfArrays::Interface::GL>::ExpressionsAssignment1
            ((ExpressionsAssignment1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsAssignment2<glcts::ArraysOfArrays::Interface::GL>::ExpressionsAssignment2
            ((ExpressionsAssignment2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsAssignment3<glcts::ArraysOfArrays::Interface::GL>::ExpressionsAssignment3
            ((ExpressionsAssignment3<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsTypeRestrictions1<glcts::ArraysOfArrays::Interface::GL>::ExpressionsTypeRestrictions1
            ((ExpressionsTypeRestrictions1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsTypeRestrictions2<glcts::ArraysOfArrays::Interface::GL>::ExpressionsTypeRestrictions2
            ((ExpressionsTypeRestrictions2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsIndexingScalar1<glcts::ArraysOfArrays::Interface::GL>::ExpressionsIndexingScalar1
            ((ExpressionsIndexingScalar1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsIndexingScalar2<glcts::ArraysOfArrays::Interface::GL>::ExpressionsIndexingScalar2
            ((ExpressionsIndexingScalar2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsIndexingScalar3<glcts::ArraysOfArrays::Interface::GL>::ExpressionsIndexingScalar3
            ((ExpressionsIndexingScalar3<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsIndexingScalar4<glcts::ArraysOfArrays::Interface::GL>::ExpressionsIndexingScalar4
            ((ExpressionsIndexingScalar4<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsIndexingArray1<glcts::ArraysOfArrays::Interface::GL>::ExpressionsIndexingArray1
            ((ExpressionsIndexingArray1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsIndexingArray2<glcts::ArraysOfArrays::Interface::GL>::ExpressionsIndexingArray2
            ((ExpressionsIndexingArray2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsIndexingArray3<glcts::ArraysOfArrays::Interface::GL>::ExpressionsIndexingArray3
            ((ExpressionsIndexingArray3<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::GL>::ExpressionsDynamicIndexing1
            ((ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::GL>::ExpressionsDynamicIndexing2
            ((ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsEquality1<glcts::ArraysOfArrays::Interface::GL>::ExpressionsEquality1
            ((ExpressionsEquality1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsEquality2<glcts::ArraysOfArrays::Interface::GL>::ExpressionsEquality2
            ((ExpressionsEquality2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::ExpressionsLength1
            ((ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsLength2<glcts::ArraysOfArrays::Interface::GL>::ExpressionsLength2
            ((ExpressionsLength2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsLength3<glcts::ArraysOfArrays::Interface::GL>::ExpressionsLength3
            ((ExpressionsLength3<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsInvalid1<glcts::ArraysOfArrays::Interface::GL>::ExpressionsInvalid1
            ((ExpressionsInvalid1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  ExpressionsInvalid2<glcts::ArraysOfArrays::Interface::GL>::ExpressionsInvalid2
            ((ExpressionsInvalid2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::InteractionFunctionCalls1
            ((InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionFunctionCalls2<glcts::ArraysOfArrays::Interface::GL>::InteractionFunctionCalls2
            ((InteractionFunctionCalls2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionArgumentAliasing1<glcts::ArraysOfArrays::Interface::GL>::InteractionArgumentAliasing1
            ((InteractionArgumentAliasing1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionArgumentAliasing2<glcts::ArraysOfArrays::Interface::GL>::InteractionArgumentAliasing2
            ((InteractionArgumentAliasing2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionArgumentAliasing3<glcts::ArraysOfArrays::Interface::GL>::InteractionArgumentAliasing3
            ((InteractionArgumentAliasing3<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionArgumentAliasing4<glcts::ArraysOfArrays::Interface::GL>::InteractionArgumentAliasing4
            ((InteractionArgumentAliasing4<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionArgumentAliasing5<glcts::ArraysOfArrays::Interface::GL>::InteractionArgumentAliasing5
            ((InteractionArgumentAliasing5<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionArgumentAliasing6<glcts::ArraysOfArrays::Interface::GL>::InteractionArgumentAliasing6
            ((InteractionArgumentAliasing6<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>::InteractionUniforms1
            ((InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionUniforms2<glcts::ArraysOfArrays::Interface::GL>::InteractionUniforms2
            ((InteractionUniforms2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionUniformBuffers1<glcts::ArraysOfArrays::Interface::GL>::InteractionUniformBuffers1
            ((InteractionUniformBuffers1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionUniformBuffers2<glcts::ArraysOfArrays::Interface::GL>::InteractionUniformBuffers2
            ((InteractionUniformBuffers2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::GL>::InteractionUniformBuffers3
            ((InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::GL>::InteractionInterfaceArrays
            ((InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionStorageBuffers1<glcts::ArraysOfArrays::Interface::GL>::InteractionStorageBuffers1
            ((InteractionStorageBuffers1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionStorageBuffers2<glcts::ArraysOfArrays::Interface::GL>::InteractionStorageBuffers2
            ((InteractionStorageBuffers2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  InteractionStorageBuffers3<glcts::ArraysOfArrays::Interface::GL>::InteractionStorageBuffers3
            ((InteractionStorageBuffers3<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  AtomicDeclarationTest<glcts::ArraysOfArrays::Interface::GL>::AtomicDeclarationTest
            ((AtomicDeclarationTest<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  AtomicUsageTest<glcts::ArraysOfArrays::Interface::GL>::AtomicUsageTest
            ((AtomicUsageTest<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::SubroutineFunctionCalls1
            ((SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SubroutineFunctionCalls2<glcts::ArraysOfArrays::Interface::GL>::SubroutineFunctionCalls2
            ((SubroutineFunctionCalls2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SubroutineArgumentAliasing1<glcts::ArraysOfArrays::Interface::GL>::SubroutineArgumentAliasing1
            ((SubroutineArgumentAliasing1<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SubroutineArgumentAliasing2<glcts::ArraysOfArrays::Interface::GL>::SubroutineArgumentAliasing2
            ((SubroutineArgumentAliasing2<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SubroutineArgumentAliasing3<glcts::ArraysOfArrays::Interface::GL>::SubroutineArgumentAliasing3
            ((SubroutineArgumentAliasing3<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  SubroutineArgumentAliasing4<glcts::ArraysOfArrays::Interface::GL>::SubroutineArgumentAliasing4
            ((SubroutineArgumentAliasing4<glcts::ArraysOfArrays::Interface::GL> *)pTVar1,context);
  tcu::TestNode::addChild((TestNode *)group,pTVar1);
  return;
}

Assistant:

void initTests(TestCaseGroup& group, glcts::Context& context)
{
	// Set up the map
	ArraysOfArrays::initializeMap<API>();

	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsPrimitive<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsStructTypes1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsStructTypes2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsStructTypes3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsStructTypes4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle5<API>(context));
	group.addChild(new glcts::ArraysOfArrays::SizedDeclarationsFunctionParams<API>(context));
	group.addChild(new glcts::ArraysOfArrays::sized_declarations_invalid_sizes1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::sized_declarations_invalid_sizes2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::sized_declarations_invalid_sizes3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::sized_declarations_invalid_sizes4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructors1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructors2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedConstructors<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConst<API>(context));

	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclInvalidConstructors1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclInvalidConstructors2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclInvalidConstructors3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclInvalidConstructors4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructorSizing1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructorSizing2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclStructConstructors<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedArrays1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedArrays2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedArrays3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclUnsizedArrays4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsAssignment1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsAssignment2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsAssignment3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsTypeRestrictions1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsTypeRestrictions2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingScalar1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingScalar2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingScalar3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingScalar4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingArray1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingArray2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsIndexingArray3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsDynamicIndexing1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsDynamicIndexing2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsEquality1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsEquality2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsLength1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsLength2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsLength3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsInvalid1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::ExpressionsInvalid2<API>(context));

	group.addChild(new glcts::ArraysOfArrays::InteractionFunctionCalls1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionFunctionCalls2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing4<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing5<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionArgumentAliasing6<API>(context));

	group.addChild(new glcts::ArraysOfArrays::InteractionUniforms1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionUniforms2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionUniformBuffers1<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionUniformBuffers2<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionUniformBuffers3<API>(context));
	group.addChild(new glcts::ArraysOfArrays::InteractionInterfaceArrays<API>(context));

	if (API::USE_STORAGE_BLOCK)
	{
		group.addChild(new glcts::ArraysOfArrays::InteractionStorageBuffers1<API>(context));
		group.addChild(new glcts::ArraysOfArrays::InteractionStorageBuffers2<API>(context));
		group.addChild(new glcts::ArraysOfArrays::InteractionStorageBuffers3<API>(context));
	}

	if (API::USE_ATOMIC)
	{
		group.addChild(new glcts::ArraysOfArrays::AtomicDeclarationTest<API>(context));
		group.addChild(new glcts::ArraysOfArrays::AtomicUsageTest<API>(context));
	}

	if (API::USE_SUBROUTINE)
	{
		group.addChild(new glcts::ArraysOfArrays::SubroutineFunctionCalls1<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineFunctionCalls2<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineArgumentAliasing1<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineArgumentAliasing2<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineArgumentAliasing3<API>(context));
		group.addChild(new glcts::ArraysOfArrays::SubroutineArgumentAliasing4<API>(context));
	}
}